

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WalkSelect(Walker *pWalker,Select *p)

{
  Select *pSVar1;
  SrcList *pSVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Select **ppSVar6;
  
  if (p != (Select *)0x0) {
    pSVar1 = (Select *)pWalker->xSelectCallback;
    while (pSVar1 != (Select *)0x0) {
      uVar3 = (*pWalker->xSelectCallback)(pWalker,p);
      if (uVar3 != 0) {
        return uVar3 & 2;
      }
      iVar4 = sqlite3WalkExprList(pWalker,p->pEList);
      if ((((iVar4 != 0) ||
           ((((p->pWhere != (Expr *)0x0 && (iVar4 = walkExpr(pWalker,p->pWhere), iVar4 != 0)) ||
             (iVar4 = sqlite3WalkExprList(pWalker,p->pGroupBy), iVar4 != 0)) ||
            ((p->pHaving != (Expr *)0x0 && (iVar4 = walkExpr(pWalker,p->pHaving), iVar4 != 0))))))
          || (iVar4 = sqlite3WalkExprList(pWalker,p->pOrderBy), iVar4 != 0)) ||
         (((p->pLimit != (Expr *)0x0 && (iVar4 = walkExpr(pWalker,p->pLimit), iVar4 != 0)) ||
          ((p->pOffset != (Expr *)0x0 && (iVar4 = walkExpr(pWalker,p->pOffset), iVar4 != 0)))))) {
        return 2;
      }
      pSVar2 = p->pSrc;
      if ((pSVar2 != (SrcList *)0x0) && (0 < pSVar2->nSrc)) {
        ppSVar6 = &pSVar2->a[0].pSelect;
        iVar4 = pSVar2->nSrc + 1;
        do {
          if ((*ppSVar6 != (Select *)0x0) &&
             (iVar5 = sqlite3WalkSelect(pWalker,*ppSVar6), iVar5 != 0)) {
            return 2;
          }
          if (((*(byte *)((long)ppSVar6 + 0x15) & 4) != 0) &&
             (iVar5 = sqlite3WalkExprList(pWalker,((anon_union_8_2_996c0f8d_for_u1 *)(ppSVar6 + 7))
                                                  ->pFuncArg), iVar5 != 0)) {
            return 2;
          }
          ppSVar6 = ppSVar6 + 0xe;
          iVar4 = iVar4 + -1;
        } while (1 < iVar4);
      }
      if (pWalker->xSelectCallback2 != (_func_void_Walker_ptr_Select_ptr *)0x0) {
        (*pWalker->xSelectCallback2)(pWalker,p);
      }
      p = p->pPrior;
      pSVar1 = p;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkSelect(Walker *pWalker, Select *p){
  int rc;
  if( p==0 ) return WRC_Continue;
  if( pWalker->xSelectCallback==0 ) return WRC_Continue;
  do{
    rc = pWalker->xSelectCallback(pWalker, p);
    if( rc ) return rc & WRC_Abort;
    if( sqlite3WalkSelectExpr(pWalker, p)
     || sqlite3WalkSelectFrom(pWalker, p)
    ){
      return WRC_Abort;
    }
    if( pWalker->xSelectCallback2 ){
      pWalker->xSelectCallback2(pWalker, p);
    }
    p = p->pPrior;
  }while( p!=0 );
  return WRC_Continue;
}